

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void mario::detail::readTimerfd(int timerfd)

{
  Writer *pWVar1;
  Writer local_98;
  ssize_t local_20;
  ssize_t n;
  uint64_t howmany;
  int timerfd_local;
  
  howmany._4_4_ = timerfd;
  local_20 = read(timerfd,&n,8);
  if (local_20 != 8) {
    el::base::Writer::Writer
              (&local_98,Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TimerQueue.cpp"
               ,0x30,"void mario::detail::readTimerfd(int)",NormalLog,0);
    pWVar1 = el::base::Writer::construct(&local_98,1,el::base::consts::kDefaultLoggerId);
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [32])"TimerQueue::handleRead() reads ");
    pWVar1 = el::base::Writer::operator<<(pWVar1,&local_20);
    el::base::Writer::operator<<(pWVar1,(char (*) [20])" bytes instead of 8");
    el::base::Writer::~Writer(&local_98);
  }
  return;
}

Assistant:

void readTimerfd(int timerfd) {
    uint64_t howmany;
    ssize_t n = ::read(timerfd, &howmany, sizeof(howmany));

    //LOG(INFO) << "TimerQueue::handleRead() " << howmany;

    if (n != sizeof(howmany)) {
        LOG(FATAL) << "TimerQueue::handleRead() reads " << n << " bytes instead of 8";
    }
}